

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

bool __thiscall miniros::Subscription::pubUpdate(Subscription *this,V_string *new_pubs)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  PublisherLink *this_00;
  pointer pcVar2;
  Level LVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  RPCManagerPtr *pRVar7;
  ostream *poVar8;
  string *psVar9;
  _Base_ptr p_Var10;
  string *psVar11;
  string *up_i;
  pointer pbVar12;
  value_type *__x;
  pointer psVar13;
  const_iterator up_i_1;
  PublisherLinkPtr *plink;
  pointer psVar14;
  V_string *__range2;
  pointer pbVar15;
  allocator<char> local_261;
  scoped_lock<std::mutex> lock;
  V_string additions;
  V_PublisherLink subtractions;
  string ownURI;
  V_PublisherLink to_add;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::mutex::lock(&this->shutdown_mutex_);
  if ((this->shutting_down_ == false) && (this->dropped_ == false)) {
    pRVar7 = RPCManager::instance();
    std::__cxx11::string::string
              ((string *)&ownURI,
               (string *)
               (pRVar7->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    pbVar15 = (new_pubs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar12 = (new_pubs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar15;
        pbVar12 = pbVar12 + 1) {
      poVar8 = std::operator<<(local_1a8,(string *)pbVar12);
      std::operator<<(poVar8,", ");
    }
    std::operator<<(local_1a8," already have these connections: ");
    __mutex = &this->publisher_links_mutex_;
    std::mutex::lock(__mutex);
    psVar13 = (this->publisher_links_).
              super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar14 = (this->publisher_links_).
                   super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar13;
        psVar14 = psVar14 + 1) {
      psVar9 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                         ((psVar14->
                          super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      poVar8 = std::operator<<(local_1a8,(string *)psVar9);
      std::operator<<(poVar8,", ");
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lock._M_device = &this->pending_connections_mutex_;
    std::mutex::lock(lock._M_device);
    p_Var1 = &(this->pending_connections_)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var10 = (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; (_Rb_tree_header *)p_Var10 != p_Var1;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
      poVar8 = std::operator<<(local_1a8,(string *)(*(long *)(p_Var10 + 1) + 0x40));
      std::operator<<(poVar8,", ");
    }
    pthread_mutex_unlock((pthread_mutex_t *)lock._M_device);
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (pubUpdate::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&additions,"miniros.subscription",(allocator<char> *)&subtractions);
      console::initializeLogLocation(&pubUpdate::loc,(string *)&additions,Debug);
      std::__cxx11::string::~string((string *)&additions);
    }
    if (pubUpdate::loc.level_ != Debug) {
      console::setLogLocationLevel(&pubUpdate::loc,Debug);
      console::checkLogLocationEnabled(&pubUpdate::loc);
    }
    pvVar4 = pubUpdate::loc.logger_;
    LVar3 = pubUpdate::loc.level_;
    if (pubUpdate::loc.logger_enabled_ == true) {
      pcVar2 = (this->name_)._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      console::print((FilterBase *)0x0,pvVar4,LVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0xf8,"bool miniros::Subscription::pubUpdate(const V_string &)",
                     "Publisher update for [%s]: %s",pcVar2,
                     additions.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&additions);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    additions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    additions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    additions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subtractions.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    subtractions.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subtractions.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_add.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_add.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    to_add.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::mutex::lock(__mutex);
    for (__x = (this->publisher_links_).
               super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar9 = (new_pubs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        __x != (this->publisher_links_).
               super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      do {
        if (psVar9 == (new_pubs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
          ::push_back(&subtractions,__x);
          break;
        }
        psVar11 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                            ((__x->
                             super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_ptr);
        bVar5 = urisEqual(psVar11,psVar9);
        psVar9 = psVar9 + 1;
      } while (!bVar5);
    }
LAB_00250fa1:
    if (psVar9 != (new_pubs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      psVar14 = (this->publisher_links_).
                super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (psVar14 ==
            (this->publisher_links_).
            super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::mutex::lock(lock._M_device);
          p_Var10 = (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          goto LAB_00250fea;
        }
        psVar11 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                            ((psVar14->
                             super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_ptr);
        bVar5 = urisEqual(psVar9,psVar11);
        psVar14 = psVar14 + 1;
      } while (!bVar5);
      goto LAB_00251032;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    psVar14 = subtractions.
              super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar13 = subtractions.
                   super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar12 = additions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, psVar13 != psVar14;
        psVar13 = psVar13 + 1) {
      psVar9 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                         ((psVar13->
                          super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      bVar5 = std::operator!=(psVar9,&ownURI);
      if (bVar5) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"miniros.subscription",&local_261);
          console::initializeLogLocation
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc,(string *)&ss,Debug);
          std::__cxx11::string::~string((string *)&ss);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc);
        }
        pvVar4 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                 ::loc.logger_;
        LVar3 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                ::loc.level_;
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.logger_enabled_ == true) {
          this_00 = (psVar13->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
          lock._M_device = (mutex_type *)(this_00->caller_id_)._M_dataplus._M_p;
          pcVar2 = (this->name_)._M_dataplus._M_p;
          psVar9 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(this_00);
          console::print((FilterBase *)0x0,pvVar4,LVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x13d,"bool miniros::Subscription::pubUpdate(const V_string &)",
                         "Disconnecting from publisher [%s] of topic [%s] at [%s]",lock._M_device,
                         pcVar2,(psVar9->_M_dataplus)._M_p);
        }
        (*((psVar13->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_PublisherLink[5])();
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"miniros.subscription",&local_261);
          console::initializeLogLocation
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc,(string *)&ss,Debug);
          std::__cxx11::string::~string((string *)&ss);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::loc.logger_,
                         pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x142,"bool miniros::Subscription::pubUpdate(const V_string &)",
                         "Disconnect: skipping myself for topic [%s]",(this->name_)._M_dataplus._M_p
                        );
        }
      }
    }
    bVar5 = true;
    for (pbVar15 = additions.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar12;
        pbVar15 = pbVar15 + 1) {
      bVar6 = std::operator!=(&ownURI,pbVar15);
      if (bVar6) {
        bVar6 = negotiateConnection(this,pbVar15);
        bVar5 = (bool)(bVar5 & bVar6);
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"miniros.subscription",&local_261);
          console::initializeLogLocation
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc,(string *)&ss,Debug);
          std::__cxx11::string::~string((string *)&ss);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                      ::loc);
        }
        if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::loc.logger_,
                         pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x14f,"bool miniros::Subscription::pubUpdate(const V_string &)",
                         "Skipping myself (%s, %s)",(this->name_)._M_dataplus._M_p,
                         ownURI._M_dataplus._M_p);
        }
      }
    }
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::~vector(&to_add);
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::~vector(&subtractions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&additions);
    std::__cxx11::string::~string((string *)&ownURI);
  }
  else {
    bVar5 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutdown_mutex_);
  return bVar5;
LAB_00250fea:
  if ((_Rb_tree_header *)p_Var10 == p_Var1) goto LAB_00251011;
  bVar5 = urisEqual(psVar9,(string *)(*(long *)(p_Var10 + 1) + 0x40));
  if (bVar5) {
    pthread_mutex_unlock((pthread_mutex_t *)lock._M_device);
    goto LAB_00251032;
  }
  p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
  goto LAB_00250fea;
LAB_00251011:
  pthread_mutex_unlock((pthread_mutex_t *)lock._M_device);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&additions,psVar9);
LAB_00251032:
  psVar9 = psVar9 + 1;
  goto LAB_00250fa1;
}

Assistant:

bool Subscription::pubUpdate(const V_string& new_pubs)
{
  std::scoped_lock<std::mutex> slock(shutdown_mutex_);

  if (shutting_down_ || dropped_)
  {
    return false;
  }

  bool retval = true;

  const std::string ownURI = RPCManager::instance()->getServerURI();
  {
    std::stringstream ss;

    for (const std::string& up_i: new_pubs)
      ss << up_i << ", ";

    ss << " already have these connections: ";
    {
      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      for (PublisherLinkPtr& plink: publisher_links_)
        ss << plink->getPublisherXMLRPCURI() << ", ";
    }

    {
      std::scoped_lock<std::mutex> lock(pending_connections_mutex_);
      for (const PendingConnectionPtr& conn: pending_connections_)
        ss << conn->getRemoteURI() << ", ";
    }

    MINIROS_DEBUG("Publisher update for [%s]: %s", name_.c_str(), ss.str().c_str());
  }

  V_string additions;
  V_PublisherLink subtractions;
  V_PublisherLink to_add;
  // could use the STL set operations... but these sets are so small
  // it doesn't really matter.
  {
    std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

    for (V_PublisherLink::iterator spc = publisher_links_.begin();
         spc!= publisher_links_.end(); ++spc)
    {
      bool found = false;
      for (V_string::const_iterator up_i = new_pubs.begin();
           !found && up_i != new_pubs.end(); ++up_i)
      {
        if (urisEqual((*spc)->getPublisherXMLRPCURI(), *up_i))
        {
          found = true;
          break;
        }
      }

      if (!found)
      {
        subtractions.push_back(*spc);
      }
    }

    for (V_string::const_iterator up_i  = new_pubs.begin(); up_i != new_pubs.end(); ++up_i)
    {
      bool found = false;
      for (V_PublisherLink::iterator spc = publisher_links_.begin();
           !found && spc != publisher_links_.end(); ++spc)
      {
        if (urisEqual(*up_i, (*spc)->getPublisherXMLRPCURI()))
        {
          found = true;
          break;
        }
      }

      if (!found)
      {
        std::scoped_lock<std::mutex> lock(pending_connections_mutex_);
        for (const PendingConnectionPtr& conn: pending_connections_)
        {
          if (urisEqual(*up_i, conn->getRemoteURI()))
          {
            found = true;
            break;
          }
        }
      }

      if (!found)
      {
        additions.push_back(*up_i);
      }
    }
  }

  for (const PublisherLinkPtr& link: subtractions)
  {
    if (link->getPublisherXMLRPCURI() != ownURI)
    {
      MINIROS_DEBUG("Disconnecting from publisher [%s] of topic [%s] at [%s]",
                  link->getCallerID().c_str(), name_.c_str(), link->getPublisherXMLRPCURI().c_str());
      link->drop();
    }
    else
    {
      MINIROS_DEBUG("Disconnect: skipping myself for topic [%s]", name_.c_str());
    }
  }

  for (const std::string& uri: additions)
  {
    // this function should never negotiate a self-subscription
    if (ownURI != uri)
    {
      retval &= negotiateConnection(uri);
    }
    else
    {
      MINIROS_DEBUG("Skipping myself (%s, %s)", name_.c_str(), ownURI.c_str());
    }
  }

  return retval;
}